

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_FieldInExtensionRange_Test::TestBody
          (ValidationErrorTest_FieldInExtensionRange_Test *this)

{
  allocator<char> local_41;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "name: \"foo.proto\" message_type {  name: \"Foo\"  field { name: \"foo\" number:  9 label:LABEL_OPTIONAL type:TYPE_INT32 }  field { name: \"bar\" number: 10 label:LABEL_OPTIONAL type:TYPE_INT32 }  field { name: \"baz\" number: 19 label:LABEL_OPTIONAL type:TYPE_INT32 }  field { name: \"moo\" number: 20 label:LABEL_OPTIONAL type:TYPE_INT32 }  extension_range { start: 10 end: 20 }}"
             ,&local_41);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_40,
            "foo.proto: Foo.bar: NUMBER: Extension range 10 to 19 includes field \"bar\" (10).\nfoo.proto: Foo.baz: NUMBER: Extension range 10 to 19 includes field \"baz\" (19).\nfoo.proto: Foo: NUMBER: Suggested field numbers for Foo: 1, 2\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&local_28,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_40);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, FieldInExtensionRange) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "message_type {"
      "  name: \"Foo\""
      "  field { name: \"foo\" number:  9 label:LABEL_OPTIONAL type:TYPE_INT32 "
      "}"
      "  field { name: \"bar\" number: 10 label:LABEL_OPTIONAL type:TYPE_INT32 "
      "}"
      "  field { name: \"baz\" number: 19 label:LABEL_OPTIONAL type:TYPE_INT32 "
      "}"
      "  field { name: \"moo\" number: 20 label:LABEL_OPTIONAL type:TYPE_INT32 "
      "}"
      "  extension_range { start: 10 end: 20 }"
      "}",

      "foo.proto: Foo.bar: NUMBER: Extension range 10 to 19 includes field "
      "\"bar\" (10).\n"
      "foo.proto: Foo.baz: NUMBER: Extension range 10 to 19 includes field "
      "\"baz\" (19).\n"
      "foo.proto: Foo: NUMBER: Suggested field numbers for Foo: 1, 2\n");
}